

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yoml-parser.h
# Opt level: O1

yoml_t * yoml__parse_node(yaml_parser_t *parser,yaml_event_type_t *unhandled,
                         yoml_parse_args_t *parse_args)

{
  size_t sVar1;
  _func_void_ptr_void_ptr_int_size_t *p_Var2;
  bool bVar3;
  int iVar4;
  yoml_t *node;
  char *pcVar5;
  size_t sVar6;
  yoml_t *pyVar7;
  yoml_t *pyVar8;
  long lVar9;
  yaml_event_t event;
  yaml_event_type_t local_9c;
  yaml_event_t local_98;
  
  if (unhandled != (yaml_event_type_t *)0x0) {
    *unhandled = YAML_NO_EVENT;
  }
  iVar4 = yaml_parser_parse(parser,&local_98);
  if (iVar4 == 0) {
    return (yoml_t *)0x0;
  }
  while ((local_98.type & ~YAML_STREAM_END_EVENT) == YAML_STREAM_START_EVENT) {
    yaml_event_delete(&local_98);
    iVar4 = yaml_parser_parse(parser,&local_98);
    if (iVar4 == 0) {
      return (yoml_t *)0x0;
    }
  }
  switch(local_98.type) {
  case YAML_ALIAS_EVENT:
    pcVar5 = parse_args->filename;
    node = (yoml_t *)malloc(0x50);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = strdup(pcVar5);
    }
    node->filename = pcVar5;
    node->type = YOML__TYPE_UNRESOLVED_ALIAS;
    node->line = local_98.start_mark.line;
    node->column = local_98.start_mark.column;
    node->anchor = (char *)0x0;
    node->tag = (char *)0x0;
    node->_refcnt = 1;
    pcVar5 = strdup((char *)local_98.data.scalar.anchor);
    (node->data).scalar = pcVar5;
    break;
  case YAML_SCALAR_EVENT:
    pcVar5 = parse_args->filename;
    node = (yoml_t *)malloc(0x50);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = strdup(pcVar5);
    }
    node->filename = pcVar5;
    node->type = YOML_TYPE_SCALAR;
    node->line = local_98.start_mark.line;
    if ((local_98.data.scalar.style & ~YAML_PLAIN_SCALAR_STYLE) == YAML_LITERAL_SCALAR_STYLE) {
      node->line = local_98.start_mark.line + 1;
    }
    node->column = local_98.start_mark.column;
    if (local_98.data.document_start.version_directive == (yaml_version_directive_t *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = strdup((char *)local_98.data.scalar.anchor);
    }
    node->anchor = pcVar5;
    if (local_98.data.document_start.tag_directives.start == (yaml_tag_directive_t *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = strdup((char *)local_98.data.scalar.tag);
    }
    node->tag = pcVar5;
    node->_refcnt = 1;
    pcVar5 = strdup((char *)local_98.data.scalar.value);
    (node->data).scalar = pcVar5;
    p_Var2 = parse_args->mem_set;
    if (p_Var2 != (_func_void_ptr_void_ptr_int_size_t *)0x0) {
      sVar6 = strlen(pcVar5);
      (*p_Var2)(local_98.data.document_start.tag_directives.end,0x41,sVar6);
    }
    break;
  case YAML_SEQUENCE_START_EVENT:
    pcVar5 = parse_args->filename;
    node = (yoml_t *)malloc(0x40);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = strdup(pcVar5);
    }
    node->filename = pcVar5;
    node->type = YOML_TYPE_SEQUENCE;
    node->line = local_98.start_mark.line;
    node->column = local_98.start_mark.column;
    if (local_98.data.document_start.version_directive == (yaml_version_directive_t *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = strdup((char *)local_98.data.scalar.anchor);
    }
    node->anchor = pcVar5;
    if (local_98.data.document_start.tag_directives.start == (yaml_tag_directive_t *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = strdup((char *)local_98.data.scalar.tag);
    }
    node->tag = pcVar5;
    node->_refcnt = 1;
    (node->data).scalar = (char *)0x0;
    do {
      pyVar7 = yoml__parse_node(parser,&local_9c,parse_args);
      if (pyVar7 == (yoml_t *)0x0) {
        if (local_9c != YAML_SEQUENCE_END_EVENT) {
          yoml_free(node,parse_args->mem_set);
          node = (yoml_t *)0x0;
        }
      }
      else {
        node = (yoml_t *)realloc(node,(node->data).sequence.size * 8 + 0x48);
        sVar1 = (node->data).sequence.size;
        (node->data).scalar = (char *)(sVar1 + 1);
        *(yoml_t **)((long)&node->data + sVar1 * 8 + 8) = pyVar7;
      }
    } while (pyVar7 != (yoml_t *)0x0);
    break;
  default:
    if (unhandled != (yaml_event_type_t *)0x0) {
      *unhandled = local_98.type;
    }
    node = (yoml_t *)0x0;
    break;
  case YAML_MAPPING_START_EVENT:
    pcVar5 = parse_args->filename;
    node = (yoml_t *)malloc(0x40);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = strdup(pcVar5);
    }
    node->filename = pcVar5;
    node->type = YOML_TYPE_MAPPING;
    node->line = local_98.start_mark.line;
    node->column = local_98.start_mark.column;
    if (local_98.data.document_start.version_directive == (yaml_version_directive_t *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = strdup((char *)local_98.data.scalar.anchor);
    }
    node->anchor = pcVar5;
    if (local_98.data.document_start.tag_directives.start == (yaml_tag_directive_t *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = strdup((char *)local_98.data.scalar.tag);
    }
    node->tag = pcVar5;
    node->_refcnt = 1;
    (node->data).scalar = (char *)0x0;
    do {
      pyVar7 = yoml__parse_node(parser,&local_9c,parse_args);
      if (pyVar7 == (yoml_t *)0x0) {
        if (local_9c != YAML_MAPPING_END_EVENT) goto LAB_00193f28;
LAB_00193f36:
        bVar3 = false;
      }
      else {
        pyVar8 = yoml__parse_node(parser,(yaml_event_type_t *)0x0,parse_args);
        if (pyVar8 == (yoml_t *)0x0) {
LAB_00193f28:
          yoml_free(node,parse_args->mem_set);
          node = (yoml_t *)0x0;
          goto LAB_00193f36;
        }
        node = (yoml_t *)realloc(node,(node->data).sequence.size * 0x10 + 0x50);
        lVar9 = (node->data).sequence.size * 0x10;
        *(yoml_t **)((long)&node->data + lVar9 + 8) = pyVar7;
        *(yoml_t **)((long)&node->data + lVar9 + 0x10) = pyVar8;
        (node->data).scalar = (char *)((node->data).sequence.size + 1);
        bVar3 = true;
      }
    } while (bVar3);
  }
  yaml_event_delete(&local_98);
  return node;
}

Assistant:

static yoml_t *yoml__parse_node(yaml_parser_t *parser, yaml_event_type_t *unhandled, yoml_parse_args_t *parse_args)
{
    yoml_t *node;
    yaml_event_t event;

    if (unhandled != NULL)
        *unhandled = YAML_NO_EVENT;

    /* wait for a node that is not a stream/doc start event */
    while (1) {
        if (!yaml_parser_parse(parser, &event))
            return NULL;
        if (!(event.type == YAML_STREAM_START_EVENT || event.type == YAML_DOCUMENT_START_EVENT))
            break;
        yaml_event_delete(&event);
    }

    switch (event.type) {
    case YAML_ALIAS_EVENT:
        node = yoml__new_node(parse_args->filename, YOML__TYPE_UNRESOLVED_ALIAS, sizeof(*node), NULL, NULL, &event);
        node->data.alias = yoml__strdup(event.data.alias.anchor);
        break;
    case YAML_SCALAR_EVENT:
        node = yoml__new_node(parse_args->filename, YOML_TYPE_SCALAR, sizeof(*node), event.data.scalar.anchor, event.data.scalar.tag, &event);
        node->data.scalar = yoml__strdup(event.data.scalar.value);
        if (parse_args->mem_set != NULL)
            parse_args->mem_set(event.data.scalar.value, 'A', strlen(node->data.scalar));
        break;
    case YAML_SEQUENCE_START_EVENT:
        node = yoml__parse_sequence(parser, &event, parse_args);
        break;
    case YAML_MAPPING_START_EVENT:
        node = yoml__parse_mapping(parser, &event, parse_args);
        break;
    default:
        node = NULL;
        if (unhandled != NULL)
            *unhandled = event.type;
        break;
    }

    yaml_event_delete(&event);

    return node;
}